

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial
              (char *source,char *dest,int compressedSize,int targetOutputSize,
              int maxDecompressedSize)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  BYTE *s;
  ushort *__src;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  size_t __n;
  BYTE *d_2;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ushort *puVar16;
  ulong uVar17;
  BYTE *d_1;
  char *pcVar18;
  char *local_90;
  long local_78 [9];
  
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  pcVar15 = dest + (long)maxDecompressedSize + -0xc;
  pcVar14 = dest + targetOutputSize;
  if (pcVar15 < dest + targetOutputSize) {
    pcVar14 = pcVar15;
  }
  if (maxDecompressedSize == 0) {
    iVar7 = -1;
    if (compressedSize == 1) {
      iVar7 = -(uint)(*source != '\0');
    }
  }
  else {
    puVar16 = (ushort *)(source + compressedSize);
    pcVar13 = dest + maxDecompressedSize;
    pcVar1 = pcVar13 + -8;
    __src = (ushort *)source;
    pcVar8 = dest;
LAB_001368f5:
    uVar5 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar10 = (uint)(byte)((byte)uVar5 >> 4);
    __n = (size_t)uVar10;
    if (uVar10 == 0xf) {
      __n = 0xf;
      do {
        uVar6 = *__src;
        __src = (ushort *)((long)__src + 1);
        __n = __n + (byte)uVar6;
        if ((ushort *)((long)puVar16 - 0xfU) <= __src) break;
      } while ((byte)uVar6 == 0xff);
      if ((long)__n < 0) goto LAB_00136ab7;
    }
    pcVar18 = pcVar8 + __n;
    puVar2 = (ushort *)((long)__src + __n);
    if ((pcVar18 <= pcVar14) && (puVar2 <= puVar16 + -4)) {
      do {
        *(undefined8 *)pcVar8 = *(undefined8 *)__src;
        pcVar8 = pcVar8 + 8;
        __src = __src + 4;
      } while (pcVar8 < pcVar18);
      pcVar8 = pcVar18 + -(ulong)*puVar2;
      __src = puVar2 + 1;
      if (pcVar8 < dest) goto LAB_00136ab7;
      uVar17 = (ulong)((byte)uVar5 & 0xf);
      if (uVar17 == 0xf) {
        uVar17 = 0xf;
        do {
          if ((ushort *)((long)puVar16 - 5U) < __src) goto LAB_00136ab7;
          uVar5 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar17 = uVar17 + (byte)uVar5;
        } while ((ulong)(byte)uVar5 == 0xff);
        if ((long)uVar17 < 0) goto LAB_00136ab7;
      }
      lVar11 = (long)pcVar18 - (long)pcVar8;
      if (lVar11 < 8) {
        lVar4 = *(long *)(&DAT_0014b0d0 + lVar11 * 8);
        pcVar9 = pcVar8 + (lVar4 - local_78[lVar11]);
        *pcVar18 = *pcVar8;
        pcVar18[1] = pcVar8[1];
        pcVar18[2] = pcVar8[2];
        pcVar18[3] = pcVar8[3];
        *(undefined4 *)(pcVar18 + 4) = *(undefined4 *)(pcVar8 + lVar4);
      }
      else {
        *(undefined8 *)pcVar18 = *(undefined8 *)pcVar8;
        pcVar9 = pcVar8 + 8;
      }
      pcVar8 = pcVar18 + uVar17 + 4;
      pcVar18 = pcVar18 + 8;
      if (pcVar15 < pcVar8) {
        if (pcVar13 + -5 < pcVar8) goto LAB_00136ab7;
        pcVar12 = pcVar18;
        local_90 = pcVar9;
        if (pcVar18 < pcVar1) {
          do {
            *(undefined8 *)pcVar12 = *(undefined8 *)local_90;
            pcVar12 = pcVar12 + 8;
            local_90 = local_90 + 8;
          } while (pcVar12 < pcVar1);
          pcVar9 = pcVar9 + ((long)pcVar1 - (long)pcVar18);
          pcVar18 = pcVar1;
        }
        for (; pcVar18 < pcVar8; pcVar18 = pcVar18 + 1) {
          cVar3 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          *pcVar18 = cVar3;
        }
      }
      else {
        do {
          *(undefined8 *)pcVar18 = *(undefined8 *)pcVar9;
          pcVar18 = pcVar18 + 8;
          pcVar9 = pcVar9 + 8;
        } while (pcVar18 < pcVar8);
      }
      goto LAB_001368f5;
    }
    if ((pcVar18 <= pcVar13) && (puVar2 <= puVar16)) {
      memcpy(pcVar8,__src,__n);
      return (int)pcVar18 - (int)dest;
    }
LAB_00136ab7:
    iVar7 = ~(uint)__src + (int)source;
  }
  return iVar7;
}

Assistant:

int LZ4_decompress_safe_partial(const char* source, char* dest, int compressedSize, int targetOutputSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize, endOnInputSize, partial, targetOutputSize, noDict, (BYTE*)dest, NULL, 0);
}